

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

CoshLayerParams * __thiscall
CoreML::Specification::CoshLayerParams::New(CoshLayerParams *this,Arena *arena)

{
  CoshLayerParams *this_00;
  
  this_00 = (CoshLayerParams *)operator_new(0x18);
  CoshLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::CoshLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

CoshLayerParams* CoshLayerParams::New(::google::protobuf::Arena* arena) const {
  CoshLayerParams* n = new CoshLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}